

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O1

DWORD * __thiscall
HMISong::MakeEvents(HMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  bool bVar1;
  DWORD *pDVar2;
  DWORD *pDVar3;
  TrackInfo *pTVar4;
  DWORD delay;
  DWORD DVar5;
  bool bVar6;
  bool sysex_noroom;
  bool local_49;
  DWORD local_48;
  uint local_44;
  DWORD *local_40;
  DWORD *local_38;
  
  if ((events < max_event_p) && (this->TrackDue != (TrackInfo *)0x0)) {
    local_44 = 0;
    delay = 0;
    local_48 = max_time;
    local_40 = events;
    do {
      DVar5 = this->TrackDue->Delay;
      delay = delay + DVar5;
      local_44 = ((this->super_MIDIStreamer).Tempo * DVar5) /
                 (uint)(this->super_MIDIStreamer).Division + local_44;
      AdvanceTracks(this,DVar5);
      DVar5 = delay;
      do {
        local_49 = false;
        pDVar3 = SendCommand(this,events,this->TrackDue,delay,(long)max_event_p - (long)events >> 2,
                             &local_49);
        bVar1 = local_49;
        pDVar2 = events;
        if (local_49 == false) {
          pTVar4 = FindNextDue(this);
          this->TrackDue = pTVar4;
          bVar6 = pDVar3 != events;
          events = pDVar3;
          delay = DVar5;
          pDVar2 = local_38;
          if (bVar6) {
            delay = 0;
            DVar5 = 0;
          }
        }
        local_38 = pDVar2;
        if (bVar1 != false) {
          return local_38;
        }
        pTVar4 = this->TrackDue;
      } while (((pTVar4 != (TrackInfo *)0x0) && (events < max_event_p)) && (pTVar4->Delay == 0));
    } while ((events == local_40 && pTVar4 != (TrackInfo *)0x0) ||
            (((events < max_event_p && (this->TrackDue != (TrackInfo *)0x0)) &&
             (delay = 0, local_44 <= local_48))));
  }
  return events;
}

Assistant:

DWORD *HMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (TrackDue && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = TrackDue->Delay;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceTracks(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, TrackDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				TrackDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (TrackDue && TrackDue->Delay == 0 && events < max_event_p);
		}
		while (start_events == events && TrackDue);
		time = 0;
	}
	return events;
}